

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# App.hpp
# Opt level: O0

bool __thiscall
CLI::App::_parse_ini
          (App *this,vector<CLI::detail::ini_ret_t,_std::allocator<CLI::detail::ini_ret_t>_> *args)

{
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  bool bVar1;
  int iVar2;
  reference this_00;
  ulong uVar3;
  pointer pAVar4;
  pointer pOVar5;
  INIError *__return_storage_ptr__;
  size_type sVar6;
  reference pvVar7;
  ConversionError *__return_storage_ptr___00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_290;
  string local_230 [2];
  invalid_argument *anon_var_0;
  size_t i;
  size_t ui;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_1c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1c0;
  iterator local_1a0;
  size_type local_198;
  string local_190;
  string local_170;
  undefined1 local_150 [8];
  string val;
  string local_128;
  reference local_108;
  Option_p *op;
  anon_class_32_1_898f2789_for__M_pred local_f8;
  __normal_iterator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_*,_std::vector<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>,_std::allocator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_>_>_>
  local_d8;
  __normal_iterator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_*,_std::vector<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>,_std::allocator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_>_>_>
  local_d0;
  __normal_iterator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_*,_std::vector<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>,_std::allocator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_>_>_>
  local_c8;
  __normal_iterator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_*,_std::vector<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>,_std::allocator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_>_>_>
  op_ptr;
  string local_b8;
  reference local_98;
  App_p *com;
  iterator __end3;
  iterator __begin3;
  vector<std::unique_ptr<CLI::App,_std::default_delete<CLI::App>_>,_std::allocator<std::unique_ptr<CLI::App,_std::default_delete<CLI::App>_>_>_>
  *__range3;
  undefined1 local_68 [8];
  string name;
  string parent;
  ini_ret_t *current;
  vector<CLI::detail::ini_ret_t,_std::allocator<CLI::detail::ini_ret_t>_> *args_local;
  App *this_local;
  
  this_00 = std::vector<CLI::detail::ini_ret_t,_std::allocator<CLI::detail::ini_ret_t>_>::back(args)
  ;
  detail::ini_ret_t::parent_abi_cxx11_((string *)((long)&name.field_2 + 8),this_00);
  detail::ini_ret_t::name_abi_cxx11_((string *)local_68,this_00);
  uVar3 = ::std::__cxx11::string::empty();
  if ((uVar3 & 1) == 0) {
    this_00->level = this_00->level + 1;
    __end3 = std::
             vector<std::unique_ptr<CLI::App,_std::default_delete<CLI::App>_>,_std::allocator<std::unique_ptr<CLI::App,_std::default_delete<CLI::App>_>_>_>
             ::begin(&this->subcommands_);
    com = (App_p *)std::
                   vector<std::unique_ptr<CLI::App,_std::default_delete<CLI::App>_>,_std::allocator<std::unique_ptr<CLI::App,_std::default_delete<CLI::App>_>_>_>
                   ::end(&this->subcommands_);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end3,(__normal_iterator<std::unique_ptr<CLI::App,_std::default_delete<CLI::App>_>_*,_std::vector<std::unique_ptr<CLI::App,_std::default_delete<CLI::App>_>,_std::allocator<std::unique_ptr<CLI::App,_std::default_delete<CLI::App>_>_>_>_>
                                       *)&com), bVar1) {
      local_98 = __gnu_cxx::
                 __normal_iterator<std::unique_ptr<CLI::App,_std::default_delete<CLI::App>_>_*,_std::vector<std::unique_ptr<CLI::App,_std::default_delete<CLI::App>_>,_std::allocator<std::unique_ptr<CLI::App,_std::default_delete<CLI::App>_>_>_>_>
                 ::operator*(&__end3);
      pAVar4 = std::unique_ptr<CLI::App,_std::default_delete<CLI::App>_>::operator->(local_98);
      ::std::__cxx11::string::string((string *)&local_b8,(string *)(name.field_2._M_local_buf + 8));
      bVar1 = check_name(pAVar4,&local_b8);
      ::std::__cxx11::string::~string((string *)&local_b8);
      if (bVar1) {
        pAVar4 = std::unique_ptr<CLI::App,_std::default_delete<CLI::App>_>::operator->(local_98);
        this_local._7_1_ = _parse_ini(pAVar4,args);
        goto LAB_00116540;
      }
      __gnu_cxx::
      __normal_iterator<std::unique_ptr<CLI::App,_std::default_delete<CLI::App>_>_*,_std::vector<std::unique_ptr<CLI::App,_std::default_delete<CLI::App>_>,_std::allocator<std::unique_ptr<CLI::App,_std::default_delete<CLI::App>_>_>_>_>
      ::operator++(&__end3);
    }
    this_local._7_1_ = false;
  }
  else {
    local_d0._M_current =
         (unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_> *)
         ::std::
         begin<std::vector<std::unique_ptr<CLI::Option,std::default_delete<CLI::Option>>,std::allocator<std::unique_ptr<CLI::Option,std::default_delete<CLI::Option>>>>>
                   (&this->options_);
    local_d8._M_current =
         (unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_> *)
         ::std::
         end<std::vector<std::unique_ptr<CLI::Option,std::default_delete<CLI::Option>>,std::allocator<std::unique_ptr<CLI::Option,std::default_delete<CLI::Option>>>>>
                   (&this->options_);
    ::std::__cxx11::string::string((string *)&local_f8,(string *)local_68);
    local_c8 = ::std::
               find_if<__gnu_cxx::__normal_iterator<std::unique_ptr<CLI::Option,std::default_delete<CLI::Option>>*,std::vector<std::unique_ptr<CLI::Option,std::default_delete<CLI::Option>>,std::allocator<std::unique_ptr<CLI::Option,std::default_delete<CLI::Option>>>>>,CLI::App::_parse_ini(std::vector<CLI::detail::ini_ret_t,std::allocator<CLI::detail::ini_ret_t>>&)::_lambda(std::unique_ptr<CLI::Option,std::default_delete<CLI::Option>>const&)_1_>
                         (local_d0,local_d8,&local_f8);
    _parse_ini(std::vector<CLI::detail::ini_ret_t,std::allocator<CLI::detail::ini_ret_t>>&)::
    {lambda(std::unique_ptr<CLI::Option,std::default_delete<CLI::Option>>const&)#1}::~unique_ptr
              ((_lambda_std__unique_ptr<CLI::Option,std::default_delete<CLI::Option>>const___1_ *)
               &local_f8);
    op = (Option_p *)
         ::std::
         end<std::vector<std::unique_ptr<CLI::Option,std::default_delete<CLI::Option>>,std::allocator<std::unique_ptr<CLI::Option,std::default_delete<CLI::Option>>>>>
                   (&this->options_);
    bVar1 = __gnu_cxx::operator==
                      (&local_c8,
                       (__normal_iterator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_*,_std::vector<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>,_std::allocator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_>_>_>
                        *)&op);
    if (bVar1) {
      this_local._7_1_ = false;
    }
    else {
      local_108 = __gnu_cxx::
                  __normal_iterator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_*,_std::vector<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>,_std::allocator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_>_>_>
                  ::operator*(&local_c8);
      pOVar5 = std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>::operator->
                         (local_108);
      bVar1 = OptionBase<CLI::Option>::get_configurable(&pOVar5->super_OptionBase<CLI::Option>);
      if (!bVar1) {
        val.field_2._M_local_buf[0xf] = '\x01';
        __return_storage_ptr__ = (INIError *)__cxa_allocate_exception(0x38);
        ::std::__cxx11::string::string((string *)&local_128,(string *)this_00);
        INIError::NotConfigurable(__return_storage_ptr__,&local_128);
        val.field_2._M_local_buf[0xf] = '\0';
        __cxa_throw(__return_storage_ptr__,&INIError::typeinfo,INIError::~INIError);
      }
      pOVar5 = std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>::operator->
                         (local_108);
      bVar1 = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::empty(&pOVar5->results_);
      if (bVar1) {
        pOVar5 = std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>::operator->
                           (local_108);
        iVar2 = Option::get_expected(pOVar5);
        if (iVar2 == 0) {
          sVar6 = std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::size(&this_00->inputs);
          if (sVar6 != 1) {
            __return_storage_ptr___00 = (ConversionError *)__cxa_allocate_exception(0x38);
            ::std::__cxx11::string::string((string *)local_230,(string *)this_00);
            ConversionError::TooManyInputsFlag(__return_storage_ptr___00,local_230);
            __cxa_throw(__return_storage_ptr___00,&ConversionError::typeinfo,
                        ConversionError::~ConversionError);
          }
          pvVar7 = std::
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::at(&this_00->inputs,0);
          ::std::__cxx11::string::string((string *)local_150,(string *)pvVar7);
          ::std::__cxx11::string::string((string *)&local_190,(string *)local_150);
          detail::to_lower(&local_170,&local_190);
          ::std::__cxx11::string::operator=((string *)local_150,(string *)&local_170);
          ::std::__cxx11::string::~string((string *)&local_170);
          ::std::__cxx11::string::~string((string *)&local_190);
          bVar1 = ::std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)local_150,"true");
          if (((bVar1) ||
              (bVar1 = ::std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                          *)local_150,"on"), bVar1)) ||
             (bVar1 = ::std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                         *)local_150,"yes"), bVar1)) {
            ui._6_1_ = 1;
            local_1c8 = &local_1c0;
            ::std::allocator<char>::allocator();
            ::std::__cxx11::string::string((string *)&local_1c0,"",(allocator *)((long)&ui + 7));
            ui._6_1_ = 0;
            local_1a0 = &local_1c0;
            local_198 = 1;
            pOVar5 = std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>::operator->
                               (local_108);
            __l._M_len = local_198;
            __l._M_array = local_1a0;
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::operator=(&pOVar5->results_,__l);
            local_290 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        &local_1a0;
            do {
              local_290 = local_290 + -1;
              ::std::__cxx11::string::~string((string *)local_290);
            } while (local_290 != &local_1c0);
            ::std::allocator<char>::~allocator((allocator<char> *)((long)&ui + 7));
          }
          else {
            bVar1 = ::std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)local_150,"false");
            if (((!bVar1) &&
                (bVar1 = ::std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                            *)local_150,"off"), !bVar1)) &&
               (bVar1 = ::std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                           *)local_150,"no"), !bVar1)) {
              i = std::__cxx11::stoul((string *)local_150,(size_t *)0x0,10);
              for (anon_var_0 = (invalid_argument *)0x0; anon_var_0 < i; anon_var_0 = anon_var_0 + 1
                  ) {
                pOVar5 = std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>::operator->
                                   (local_108);
                ::std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
                emplace_back<char_const(&)[1]>
                          ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                           &pOVar5->results_,(char (*) [1])0x12b18f);
              }
            }
          }
          ::std::__cxx11::string::~string((string *)local_150);
        }
        else {
          pOVar5 = std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>::operator->
                             (local_108);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::operator=(&pOVar5->results_,&this_00->inputs);
          pOVar5 = std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>::operator->
                             (local_108);
          Option::run_callback(pOVar5);
        }
      }
      std::vector<CLI::detail::ini_ret_t,_std::allocator<CLI::detail::ini_ret_t>_>::pop_back(args);
      this_local._7_1_ = true;
    }
  }
LAB_00116540:
  op_ptr._M_current._4_4_ = 1;
  ::std::__cxx11::string::~string((string *)local_68);
  ::std::__cxx11::string::~string((string *)(name.field_2._M_local_buf + 8));
  return this_local._7_1_;
}

Assistant:

bool _parse_ini(std::vector<detail::ini_ret_t> &args) {
        detail::ini_ret_t &current = args.back();
        std::string parent = current.parent(); // respects current.level
        std::string name = current.name();

        // If a parent is listed, go to a subcommand
        if(!parent.empty()) {
            current.level++;
            for(const App_p &com : subcommands_)
                if(com->check_name(parent))
                    return com->_parse_ini(args);
            return false;
        }

        auto op_ptr = std::find_if(
            std::begin(options_), std::end(options_), [name](const Option_p &v) { return v->check_lname(name); });

        if(op_ptr == std::end(options_))
            return false;

        // Let's not go crazy with pointer syntax
        Option_p &op = *op_ptr;

        if(!op->get_configurable())
            throw INIError::NotConfigurable(current.fullname);

        if(op->results_.empty()) {
            // Flag parsing
            if(op->get_expected() == 0) {
                if(current.inputs.size() == 1) {
                    std::string val = current.inputs.at(0);
                    val = detail::to_lower(val);
                    if(val == "true" || val == "on" || val == "yes")
                        op->results_ = {""};
                    else if(val == "false" || val == "off" || val == "no")
                        ;
                    else
                        try {
                            size_t ui = std::stoul(val);
                            for(size_t i = 0; i < ui; i++)
                                op->results_.emplace_back("");
                        } catch(const std::invalid_argument &) {
                            throw ConversionError::TrueFalse(current.fullname);
                        }
                } else
                    throw ConversionError::TooManyInputsFlag(current.fullname);
            } else {
                op->results_ = current.inputs;
                op->run_callback();
            }
        }

        args.pop_back();
        return true;
    }